

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.cpp
# Opt level: O1

double maxBias(vector<int,_std::allocator<int>_> *counts,int reps)

{
  pointer piVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 in_XMM6_Qb;
  
  piVar1 = (counts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar2 = (uint)((ulong)((long)(counts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
  if (0 < (int)uVar2) {
    auVar4 = ZEXT816(0) << 0x40;
    uVar3 = 0;
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    do {
      auVar6._0_8_ = (double)piVar1[uVar3] / (double)reps;
      auVar6._8_8_ = in_XMM6_Qb;
      auVar6 = vfmadd213sd_fma(auVar6,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
      auVar6 = vandpd_avx(auVar6,auVar5);
      auVar4 = vmaxsd_avx(auVar6,auVar4);
      uVar3 = uVar3 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar3);
    return auVar4._0_8_;
  }
  return 0.0;
}

Assistant:

double maxBias ( std::vector<int> & counts, int reps )
{
  double worst = 0;

  for(int i = 0; i < (int)counts.size(); i++)
  {
    double c = double(counts[i]) / double(reps);

    double d = fabs(c * 2 - 1);

    if(d > worst)
    {
      worst = d;
    }
  }

  return worst;
}